

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwpq_vdpp_proc.cpp
# Opt level: O2

int hwpq_vdpp_init(rk_vdpp_context *p_ctx_ptr)

{
  _func_MPP_RET_VdppCtx_ptr *p_Var1;
  MPP_RET MVar2;
  undefined8 *ptr;
  vdpp_com_ctx *com_ctx;
  MppBufferGroup memGroup;
  MppBuffer histbuf;
  
  memGroup = (MppBufferGroup)0x0;
  histbuf = (MppBuffer)0x0;
  if (((byte)hwpq_vdpp_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"line(%d), func(%s), enter",(char *)0x0,0x279,"hwpq_vdpp_init");
  }
  if (p_ctx_ptr == (rk_vdpp_context *)0x0) {
    _mpp_log_l(2,(char *)0x0,"found NULL vdpp ctx pointer\n",(char *)0x0);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    ptr = (undefined8 *)mpp_osal_malloc("hwpq_vdpp_init",0x18);
    if (ptr != (undefined8 *)0x0) {
      com_ctx = rockchip_vdpp_api_alloc_ctx();
      if ((com_ctx == (vdpp_com_ctx *)0x0) || (com_ctx->ops == (vdpp_com_ops *)0x0)) {
        _mpp_log_l(2,(char *)0x0,"alloc vdpp ctx failed!",(char *)0x0);
        MVar2 = MPP_ERR_MALLOC;
      }
      else {
        MVar2 = mpp_buffer_group_get
                          (&memGroup,MPP_BUFFER_TYPE_DRM,MPP_BUFFER_INTERNAL,(char *)0x0,
                           "hwpq_vdpp_init");
        if (MVar2 == MPP_OK) {
          mpp_buffer_get_with_tag(memGroup,&histbuf,0x2800,(char *)0x0,"hwpq_vdpp_init");
          mpp_env_get_u32("vendor.vdpp.debug_cfg",&hwpq_vdpp_debug,0);
          p_Var1 = com_ctx->ops->init;
          if ((p_Var1 == (_func_MPP_RET_VdppCtx_ptr *)0x0) ||
             (MVar2 = (*p_Var1)(&com_ctx->priv), MVar2 == MPP_OK)) {
            *ptr = com_ctx;
            ptr[1] = memGroup;
            ptr[2] = histbuf;
            *p_ctx_ptr = ptr;
            if (((byte)hwpq_vdpp_debug & 1) == 0) {
              return 0;
            }
            _mpp_log_l(4,(char *)0x0,"line(%d), func(%s), leave",(char *)0x0,0x2ad,"hwpq_vdpp_init")
            ;
            return 0;
          }
          _mpp_log_l(2,(char *)0x0,"vdpp init failed! ret %d\n","hwpq_vdpp_init",(ulong)(uint)MVar2)
          ;
          if (histbuf != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(histbuf,"hwpq_vdpp_init");
            histbuf = (MppBuffer)0x0;
          }
        }
        else {
          _mpp_log_l(2,(char *)0x0,"memGroup mpp_buffer_group_get failed\n",(char *)0x0);
          MVar2 = MPP_NOK;
        }
      }
      goto LAB_00114c38;
    }
    _mpp_log_l(2,(char *)0x0,"alloc vdpp ctx failed!",(char *)0x0);
    MVar2 = MPP_ERR_MALLOC;
  }
  com_ctx = (vdpp_com_ctx *)0x0;
  ptr = (undefined8 *)0x0;
LAB_00114c38:
  if (memGroup != (MppBufferGroup)0x0) {
    mpp_buffer_group_put(memGroup);
    memGroup = (MppBufferGroup)0x0;
  }
  rockchip_vdpp_api_release_ctx(com_ctx);
  if (ptr != (undefined8 *)0x0) {
    mpp_osal_free("hwpq_vdpp_init",ptr);
  }
  return MVar2;
}

Assistant:

int hwpq_vdpp_init(rk_vdpp_context *p_ctx_ptr)
{
    VdppCtxImpl *p = NULL;
    vdpp_com_ctx *vdpp = NULL;
    MppBufferGroup memGroup = NULL;
    MppBuffer histbuf = NULL;
    MPP_RET ret = MPP_NOK;

    hwpq_vdpp_enter();

    if (NULL == p_ctx_ptr) {
        mpp_err("found NULL vdpp ctx pointer\n");
        ret = MPP_ERR_NULL_PTR;
        goto __ERR;
    }
    /* alloc vdpp ctx impl */
    p = mpp_malloc(VdppCtxImpl, 1);
    if (NULL == p) {
        mpp_err("alloc vdpp ctx failed!");
        ret = MPP_ERR_MALLOC;
        goto __ERR;
    }
    /* alloc vdpp */
    vdpp = rockchip_vdpp_api_alloc_ctx();
    if (NULL == vdpp || NULL == vdpp->ops) {
        mpp_err("alloc vdpp ctx failed!");
        ret = MPP_ERR_MALLOC;
        goto __ERR;
    }
    /* alloc buffer group */
    ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        ret = MPP_NOK;
        goto __ERR;
    }

    mpp_buffer_get(memGroup, &histbuf, VDPP_HIST_LENGTH);
    if (ret) {
        mpp_err("alloc histbuf failed\n");
        ret = MPP_NOK;
        goto __ERR;
    }

    /* setup env prop */
    mpp_env_get_u32(HWPQ_VDPP_DEBUG_CFG_PROP, &hwpq_vdpp_debug, 0);

    if (vdpp->ops->init) {
        ret = vdpp->ops->init(&vdpp->priv);
        if (ret) {
            mpp_err_f("vdpp init failed! ret %d\n", ret);
            goto __ERR;
        }
    }

    p->vdpp = vdpp;
    p->memGroup = memGroup;
    p->histbuf = histbuf;
    *p_ctx_ptr = (rk_vdpp_context)p;

    hwpq_vdpp_leave();
    return ret;

__ERR:
    if (histbuf) {
        mpp_buffer_put(histbuf);
        histbuf = NULL;
    }

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    rockchip_vdpp_api_release_ctx(vdpp);
    MPP_FREE(p);

    return ret;
}